

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O2

size_t __thiscall
helics::tcp::TcpComms::dataReceive
          (TcpComms *this,TcpConnection *connection,char *data,size_t bytes_received)

{
  size_t sVar1;
  size_t __n;
  void *__buf;
  int in_R8D;
  size_t sVar2;
  ActionMessage rep;
  ActionMessage local_1c8;
  string local_108;
  ActionMessage local_e8;
  
  sVar2 = 0;
  __n = bytes_received;
  do {
    if (bytes_received < sVar2 || bytes_received - sVar2 == 0) {
      return sVar2;
    }
    local_1c8.messageAction = cmd_ignore;
    local_1c8.messageID = 0;
    local_1c8.source_id.gid = 0;
    local_1c8.source_handle.hid = -1700000000;
    local_1c8.dest_id.gid = 0;
    local_1c8.dest_handle.hid = -1700000000;
    local_1c8.payload.buffer._M_elems[0x38] = 0;
    local_1c8.payload.buffer._M_elems[0x39] = 0;
    local_1c8.payload.buffer._M_elems[0x3a] = 0;
    local_1c8.payload.buffer._M_elems[0x3b] = 0;
    local_1c8.payload.buffer._M_elems[0x3c] = 0;
    local_1c8.payload.buffer._M_elems[0x3d] = 0;
    local_1c8.payload.buffer._M_elems[0x3e] = 0;
    local_1c8.payload.buffer._M_elems[0x3f] = 0;
    local_1c8.payload.bufferSize = 0;
    local_1c8.payload.buffer._M_elems[0x28] = 0;
    local_1c8.payload.buffer._M_elems[0x29] = 0;
    local_1c8.payload.buffer._M_elems[0x2a] = 0;
    local_1c8.payload.buffer._M_elems[0x2b] = 0;
    local_1c8.payload.buffer._M_elems[0x2c] = 0;
    local_1c8.payload.buffer._M_elems[0x2d] = 0;
    local_1c8.payload.buffer._M_elems[0x2e] = 0;
    local_1c8.payload.buffer._M_elems[0x2f] = 0;
    local_1c8.payload.buffer._M_elems[0x30] = 0;
    local_1c8.payload.buffer._M_elems[0x31] = 0;
    local_1c8.payload.buffer._M_elems[0x32] = 0;
    local_1c8.payload.buffer._M_elems[0x33] = 0;
    local_1c8.payload.buffer._M_elems[0x34] = 0;
    local_1c8.payload.buffer._M_elems[0x35] = 0;
    local_1c8.payload.buffer._M_elems[0x36] = 0;
    local_1c8.payload.buffer._M_elems[0x37] = 0;
    local_1c8.payload.buffer._M_elems[0x18] = 0;
    local_1c8.payload.buffer._M_elems[0x19] = 0;
    local_1c8.payload.buffer._M_elems[0x1a] = 0;
    local_1c8.payload.buffer._M_elems[0x1b] = 0;
    local_1c8.payload.buffer._M_elems[0x1c] = 0;
    local_1c8.payload.buffer._M_elems[0x1d] = 0;
    local_1c8.payload.buffer._M_elems[0x1e] = 0;
    local_1c8.payload.buffer._M_elems[0x1f] = 0;
    local_1c8.payload.buffer._M_elems[0x20] = 0;
    local_1c8.payload.buffer._M_elems[0x21] = 0;
    local_1c8.payload.buffer._M_elems[0x22] = 0;
    local_1c8.payload.buffer._M_elems[0x23] = 0;
    local_1c8.payload.buffer._M_elems[0x24] = 0;
    local_1c8.payload.buffer._M_elems[0x25] = 0;
    local_1c8.payload.buffer._M_elems[0x26] = 0;
    local_1c8.payload.buffer._M_elems[0x27] = 0;
    local_1c8.payload.buffer._M_elems[8] = 0;
    local_1c8.payload.buffer._M_elems[9] = 0;
    local_1c8.payload.buffer._M_elems[10] = 0;
    local_1c8.payload.buffer._M_elems[0xb] = 0;
    local_1c8.payload.buffer._M_elems[0xc] = 0;
    local_1c8.payload.buffer._M_elems[0xd] = 0;
    local_1c8.payload.buffer._M_elems[0xe] = 0;
    local_1c8.payload.buffer._M_elems[0xf] = 0;
    local_1c8.payload.buffer._M_elems[0x10] = 0;
    local_1c8.payload.buffer._M_elems[0x11] = 0;
    local_1c8.payload.buffer._M_elems[0x12] = 0;
    local_1c8.payload.buffer._M_elems[0x13] = 0;
    local_1c8.payload.buffer._M_elems[0x14] = 0;
    local_1c8.payload.buffer._M_elems[0x15] = 0;
    local_1c8.payload.buffer._M_elems[0x16] = 0;
    local_1c8.payload.buffer._M_elems[0x17] = 0;
    local_1c8.Tso.internalTimeCode = 0;
    local_1c8.payload.buffer._M_elems[0] = 0;
    local_1c8.payload.buffer._M_elems[1] = 0;
    local_1c8.payload.buffer._M_elems[2] = 0;
    local_1c8.payload.buffer._M_elems[3] = 0;
    local_1c8.payload.buffer._M_elems[4] = 0;
    local_1c8.payload.buffer._M_elems[5] = 0;
    local_1c8.payload.buffer._M_elems[6] = 0;
    local_1c8.payload.buffer._M_elems[7] = 0;
    local_1c8.Te.internalTimeCode = 0;
    local_1c8.Tdemin.internalTimeCode = 0;
    local_1c8.counter = 0;
    local_1c8.flags = 0;
    local_1c8.sequenceID = 0;
    local_1c8.actionTime.internalTimeCode = 0;
    local_1c8.payload.bufferCapacity = 0x40;
    local_1c8.payload.heap = (byte *)&local_1c8.payload;
    local_1c8.stringData.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.stringData.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.payload.nonOwning = false;
    local_1c8.payload.locked = false;
    local_1c8.payload.usingAllocatedBuffer = false;
    local_1c8.payload.errorCondition = '\0';
    local_1c8.payload.userKey = 0;
    local_1c8.stringData.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sVar1 = ActionMessage::depacketize(&local_1c8,data + sVar2,bytes_received - sVar2);
    if (sVar1 != 0) {
      if (((local_1c8.messageAction == cmd_protocol_priority) ||
          (local_1c8.messageAction == cmd_protocol_big)) ||
         (local_1c8.messageAction == cmd_protocol)) {
        NetworkCommsInterface::generateReplyToIncomingMessage
                  (&local_e8,&this->super_NetworkCommsInterface,&local_1c8);
        if (local_e8.messageAction == cmd_ignore) {
          gmlc::containers::
          BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
          push<helics::ActionMessage>(&this->rxMessageQueue,&local_1c8);
        }
        else {
          ActionMessage::packetize_abi_cxx11_(&local_108,&local_e8);
          gmlc::networking::TcpConnection::send(connection,(int)&local_108,__buf,__n,in_R8D);
          std::__cxx11::string::~string((string *)&local_108);
        }
        ActionMessage::~ActionMessage(&local_e8);
      }
      else if ((this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback.
               super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(helics::ActionMessage_&&)>::operator()
                  (&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback,
                   &local_1c8);
      }
      sVar2 = sVar2 + sVar1;
    }
    ActionMessage::~ActionMessage(&local_1c8);
  } while (sVar1 != 0);
  return sVar2;
}

Assistant:

size_t TcpComms::dataReceive(gmlc::networking::TcpConnection* connection,
                             const char* data,
                             size_t bytes_received)
{
    size_t used_total = 0;
    while (used_total < bytes_received) {
        ActionMessage m;
        auto used = m.depacketize(reinterpret_cast<const std::byte*>(data) + used_total,
                                  bytes_received - used_total);
        if (used == 0) {
            break;
        }
        if (isProtocolCommand(m)) {
            // if the reply is not ignored respond with it otherwise
            // forward the original message on to the receiver to handle
            auto rep = generateReplyToIncomingMessage(m);
            if (rep.action() != CMD_IGNORE) {
                try {
                    connection->send(rep.packetize());
                }
                catch (const std::system_error&) {
                }
            } else {
                rxMessageQueue.push(std::move(m));
            }
        } else {
            if (ActionCallback) {
                ActionCallback(std::move(m));
            }
        }
        used_total += used;
    }

    return used_total;
}